

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hooking.cpp
# Opt level: O2

void __thiscall
ChickenHook::trampoline_receiver(ChickenHook *this,int param_1,siginfo_t *si,void *arg)

{
  ulong uVar1;
  Trampoline *pTVar2;
  void *pvVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  undefined4 *puVar5;
  Trampoline *pTVar6;
  double in_XMM0_Qa;
  double __x;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  Trampoline trampoline;
  Trampoline local_c0;
  
  puVar5 = (undefined4 *)CONCAT44(in_register_00000034,param_1);
  __x = log(in_XMM0_Qa);
  if (trampolines == DAT_0014a6c8) {
    __x = log(__x);
  }
  pTVar2 = DAT_0014a6c8;
  for (pTVar6 = trampolines; pTVar6 != pTVar2; pTVar6 = pTVar6 + 1) {
    Trampoline::Trampoline(&local_c0,pTVar6);
    pvVar4 = *(void **)(puVar5 + 4);
    pvVar3 = Trampoline::getOriginal(&local_c0);
    if (pvVar3 <= pvVar4) {
      uVar1 = *(ulong *)(puVar5 + 4);
      pvVar4 = Trampoline::getOriginal(&local_c0);
      if (uVar1 <= (long)pvVar4 + 0x40U) {
        log(__x_00);
        pvVar4 = Trampoline::getHook(&local_c0);
        log(__x_01);
        si[1]._sifields._sigchld.si_stime = (__clock_t)pvVar4;
        *puVar5 = 0x12;
      }
    }
    Trampoline::~Trampoline(&local_c0);
    __x = extraout_XMM0_Qa;
  }
  log(__x);
  return;
}

Assistant:

static void trampoline_receiver(int, siginfo_t *si, void *arg) {
        log("Caught segfault at address <%p>", si->si_addr);

        auto *p = (ucontext_t *) arg;
        if (trampolines.empty()) {
            log("Warning!! trampoline size is 0");
        }

        // search the corresponding trampoline
        for (auto trampoline : trampolines) {
            if (si->si_addr >= trampoline.getOriginal() &&
                si->si_addr <= ((uint8_t *) trampoline.getOriginal()) + CODE_SIZE) {
                log("Found hook <%p>", si->si_addr);
                void *hook = trampoline.getHook();
                auto hookFun = (void (*)()) hook;
                log("Overwrite pc");
                // now set the pc to our hook function
#if defined(__APPLE__) && (__x86_64__)
                p->uc_mcontext->__ss.__rip = reinterpret_cast<register_t>(hookFun);
#elif defined(__APPLE__) && (__i386__)
                p->uc_mcontext->__ss.__eip = reinterpret_cast<register_t>(hookFun);
#else
#ifdef __i386__
                p->uc_mcontext.gregs[REG_EIP] = reinterpret_cast<greg_t>(hookFun);
#elif __aarch64__
                p->uc_mcontext.pc = reinterpret_cast<greg_t>(hookFun);
#elif __x86_64__
                p->uc_mcontext.gregs[REG_RIP] = reinterpret_cast<greg_t>(hookFun);
#else
#error "UNSUPPORTED"
#endif
#endif
                si->si_signo = SIGCONT;
            }

        }
        log("Continue execution");
    }